

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_index.h
# Opt level: O2

void __thiscall S2CellIndex::RangeIterator::Next(RangeIterator *this)

{
  bool bVar1;
  S2LogMessage SStack_18;
  
  bVar1 = done(this);
  if (!bVar1) {
    (this->it_)._M_current = (this->it_)._M_current + 1;
    return;
  }
  S2LogMessage::S2LogMessage
            (&SStack_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_index.h"
             ,0x1fa,kFatal,(ostream *)&std::cerr);
  std::operator<<(SStack_18.stream_,"Check failed: !done() ");
  abort();
}

Assistant:

inline void S2CellIndex::RangeIterator::Next() {
  S2_DCHECK(!done());
  ++it_;
}